

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O1

void address_space_stl_internal_cached_slow_mips
               (uc_struct_conflict4 *uc,MemoryRegionCache *cache,hwaddr addr,uint32_t val,
               MemTxAttrs attrs,MemTxResult *result,device_endian endian)

{
  MemTxResult MVar1;
  uint32_t *puVar2;
  AddressSpace **target_as_00;
  IOMMUMemoryRegion *iommu_mr;
  hwaddr l;
  AddressSpace *target_as;
  ulong uVar3;
  undefined1 local_70 [8];
  MemoryRegionSection local_68;
  
  uVar3 = 4;
  if (cache->ptr == (void *)0x0) {
    target_as_00 = (AddressSpace **)(addr + cache->xlat);
    iommu_mr = (IOMMUMemoryRegion *)(cache->mrs).mr;
    if ((iommu_mr != (IOMMUMemoryRegion *)0x0) && ((iommu_mr->parent_obj).is_iommu != false)) {
      address_space_translate_iommu
                (&local_68,iommu_mr,(hwaddr *)&stack0xffffffffffffff80,
                 (hwaddr *)&stack0xffffffffffffff88,(hwaddr *)&DAT_00000001,SUB81(local_70,0),
                 attrs._0_1_,target_as_00,(MemTxAttrs)0x4);
      iommu_mr = (IOMMUMemoryRegion *)local_68.mr;
    }
    if (((uVar3 < 4) || ((iommu_mr->parent_obj).ram != true)) ||
       ((iommu_mr->parent_obj).readonly == true)) {
      MVar1 = memory_region_dispatch_write_mips
                        (uc,&iommu_mr->parent_obj,(hwaddr)target_as_00,(ulong)val,
                         (uint)(endian != DEVICE_LITTLE_ENDIAN) * 8 + MO_32,attrs);
    }
    else {
      puVar2 = (uint32_t *)
               qemu_map_ram_ptr_mips
                         ((uc_struct_conflict4 *)(iommu_mr->parent_obj).uc,
                          (iommu_mr->parent_obj).ram_block,(ram_addr_t)target_as_00);
      if ((endian == DEVICE_BIG_ENDIAN) || (endian != DEVICE_LITTLE_ENDIAN)) {
        val = val >> 0x18 | (val & 0xff0000) >> 8 | (val & 0xff00) << 8 | val << 0x18;
      }
      *puVar2 = val;
      MVar1 = 0;
    }
    if (result != (MemTxResult *)0x0) {
      *result = MVar1;
    }
    return;
  }
  __assert_fail("!cache->ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                ,0x7b1,
                "MemoryRegion *address_space_translate_cached(MemoryRegionCache *, hwaddr, hwaddr *, hwaddr *, _Bool, MemTxAttrs)"
               );
}

Assistant:

static inline void glue(address_space_stl_internal, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs,
    MemTxResult *result, enum device_endian endian)
{
    uint8_t *ptr;
    MemoryRegion *mr;
    hwaddr l = 4;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, true, attrs);
    if (l < 4 || !memory_access_is_direct(mr, true)) {
        release_lock |= prepare_mmio_access(mr);
        r = memory_region_dispatch_write(uc, mr, addr1, val,
                                         MO_32 | devend_memop(endian), attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        switch (endian) {
        case DEVICE_LITTLE_ENDIAN:
            stl_le_p(ptr, val);
            break;
        case DEVICE_BIG_ENDIAN:
            stl_be_p(ptr, val);
            break;
        default:
            stl_p(ptr, val);
            break;
        }
        invalidate_and_set_dirty(mr, addr1, 4);
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
}